

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Tag * __thiscall
wasm::Module::addTag(Module *this,unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *curr)

{
  Tag *pTVar1;
  allocator<char> local_41;
  string local_40;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_20;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *local_18;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *curr_local;
  Module *this_local;
  
  local_18 = curr;
  curr_local = (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)this;
  std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::unique_ptr(&local_20,curr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"addTag",&local_41);
  pTVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>,std::unordered_map<wasm::Name,wasm::Tag*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Tag*>>>,wasm::Tag>
                     (&this->tags,&this->tagsMap,&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_20);
  return pTVar1;
}

Assistant:

Tag* Module::addTag(std::unique_ptr<Tag>&& curr) {
  return addModuleElement(tags, tagsMap, std::move(curr), "addTag");
}